

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engrave.c
# Opt level: O1

engr * engr_at(level *lev,xchar x,xchar y)

{
  engr *peVar1;
  
  peVar1 = lev->lev_engr;
  while( true ) {
    if (peVar1 == (engr *)0x0) {
      return (engr *)0x0;
    }
    if ((peVar1->engr_x == x) && (peVar1->engr_y == y)) break;
    peVar1 = peVar1->nxt_engr;
  }
  return peVar1;
}

Assistant:

struct engr *engr_at(struct level *lev, xchar x, xchar y)
{
	struct engr *ep = lev->lev_engr;

	while (ep) {
		if (x == ep->engr_x && y == ep->engr_y)
			return ep;
		ep = ep->nxt_engr;
	}
	return NULL;
}